

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::UniformLocImplicitInSomeStages::Run(UniformLocImplicitInSomeStages *this)

{
  long lVar1;
  Loc _location;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformType local_270;
  Uniform local_1e0;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_270,0x1406,0);
  _location.super_LayoutSpecifierBase.occurence.occurence = FSH_OR_CSH;
  _location.super_LayoutSpecifierBase.val = 3;
  _location.super_LayoutSpecifierBase.numSys = Dec;
  anon_unknown_0::Uniform::Uniform
            (&local_1e0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_270,_location,(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_1e0);
  anon_unknown_0::Uniform::~Uniform(&local_1e0);
  UniformType::~UniformType(&local_270);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&uniforms);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&uniforms);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//One shader: uniform float u0;
		//Another shader: layout (location = 3) uniform float  u0;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(3, DefOccurence::FSH_OR_CSH)));
		return doRun(uniforms);
	}